

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O0

void __thiscall cmInstalledFile::SetName(cmInstalledFile *this,cmMakefile *mf,string *name)

{
  PositionType *__return_storage_ptr__;
  cmCompiledGeneratorExpression *pcVar1;
  undefined1 local_b8 [32];
  cmGeneratorExpression ge;
  cmListFileBacktrace backtrace;
  string *name_local;
  cmMakefile *mf_local;
  cmInstalledFile *this_local;
  
  __return_storage_ptr__ = &ge.Backtrace.Snapshot.Position.Position;
  cmMakefile::GetBacktrace((cmListFileBacktrace *)__return_storage_ptr__,mf);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)(local_b8 + 0x18),
             (cmListFileBacktrace *)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)this,(string *)name);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_b8,(string *)(local_b8 + 0x18));
  pcVar1 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::release
                     ((auto_ptr<cmCompiledGeneratorExpression> *)local_b8);
  this->NameExpression = pcVar1;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_b8);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)(local_b8 + 0x18));
  cmListFileBacktrace::~cmListFileBacktrace
            ((cmListFileBacktrace *)&ge.Backtrace.Snapshot.Position.Position);
  return;
}

Assistant:

void cmInstalledFile::SetName(cmMakefile* mf, const std::string& name)
{
  cmListFileBacktrace backtrace = mf->GetBacktrace();
  cmGeneratorExpression ge(backtrace);

  this->Name = name;
  this->NameExpression = ge.Parse(name).release();
}